

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  cmListFileContext *pcVar1;
  string *text;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  cmListFileArgument *arg;
  pointer pcVar6;
  pointer lff_00;
  MessageType messageType;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range6;
  string err;
  string errorString;
  cmListFileContext execContext;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_208;
  allocator<char> local_201;
  undefined1 local_200 [16];
  _Elt_pointer pvStack_1f0;
  _Elt_pointer local_1e8;
  cmExecutionStatus *local_1d8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *local_1d0;
  undefined1 local_1c8 [16];
  string local_1b8;
  undefined1 local_198 [32];
  cmCommandName local_178;
  __node_base local_138;
  cmListFileContext local_130;
  cmListFileContext local_e8;
  cmConditionEvaluator local_a0;
  
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "while");
  if (bVar4) {
    this->Depth = this->Depth + 1;
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff
                            ,"endwhile");
    if (bVar4) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_200,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar4 = (_Map_pointer)local_200._0_8_ != (_Map_pointer)0x0;
        if (!bVar4) {
          return bVar4;
        }
        local_198._0_8_ = local_198 + 0x10;
        local_198._8_8_ = (_Base_ptr)0x0;
        local_198[0x10] = '\0';
        local_200._8_8_ = 0;
        pvStack_1f0 = (_Elt_pointer)0x0;
        local_1e8 = (_Elt_pointer)0x0;
        local_1d0 = &this->Args;
        cmMakefile::ExpandArguments
                  (mf,local_1d0,
                   (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   (local_200 + 8),(char *)0x0);
        pcVar1 = &(this->super_cmFunctionBlocker).StartingContext;
        cmListFileContext::cmListFileContext(&local_e8,pcVar1);
        local_178.Lower._M_dataplus._M_p = (pointer)&local_178.Lower.field_2;
        local_178.Lower._M_string_length = 0;
        local_178.Lower.field_2._M_local_buf[0] = '\0';
        local_178.Original._M_dataplus._M_p = (pointer)&local_178.Original.field_2;
        local_178.Original._M_string_length = 0;
        local_178.Original.field_2._M_local_buf[0] = '\0';
        local_138._M_nxt = (_Hash_node_base *)local_e8.Line;
        cmCommandContext::cmCommandName::operator=(&local_178,&local_e8.Name);
        cmListFileContext::cmListFileContext(&local_130,pcVar1);
        cmMakefile::GetBacktrace((cmMakefile *)local_1c8,(cmCommandContext *)mf);
        cmConditionEvaluator::cmConditionEvaluator
                  (&local_a0,mf,&local_130,(cmListFileBacktrace *)local_1c8);
        local_1d8 = inStatus;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
        cmListFileContext::~cmListFileContext(&local_130);
        bVar5 = cmConditionEvaluator::IsTrue
                          (&local_a0,
                           (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)(local_200 + 8),(string *)local_198,&local_208);
        text = (string *)(local_1c8 + 0x10);
        do {
          if (bVar5 == false) {
LAB_001bd2ae:
            cmConditionEvaluator::~cmConditionEvaluator(&local_a0);
            cmCommandContext::cmCommandName::~cmCommandName(&local_178);
            cmListFileContext::~cmListFileContext(&local_e8);
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *
                    )(local_200 + 8));
            std::__cxx11::string::~string((string *)local_198);
            if ((_Map_pointer)local_200._0_8_ == (_Map_pointer)0x0) {
              return bVar4;
            }
            (*(code *)(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         **)local_200._0_8_)[1].
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)();
            return bVar4;
          }
          if ((_Base_ptr)local_198._8_8_ != (_Base_ptr)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)text,"had incorrect arguments: ",&local_201);
            pcVar2 = (this->Args).
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            for (pcVar6 = (this->Args).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_start; pcVar6 != pcVar2;
                pcVar6 = pcVar6 + 1) {
              std::__cxx11::string::append((char *)text);
              std::__cxx11::string::append((string *)text);
              std::__cxx11::string::append((char *)text);
              std::__cxx11::string::append((char *)text);
            }
            std::__cxx11::string::append((char *)text);
            std::__cxx11::string::append((string *)text);
            std::__cxx11::string::append((char *)text);
            cmMakefile::IssueMessage(mf,local_208,text);
            if (local_208 == FATAL_ERROR) {
              cmSystemTools::s_FatalErrorOccured = true;
              std::__cxx11::string::~string((string *)(local_1c8 + 0x10));
              goto LAB_001bd2ae;
            }
            std::__cxx11::string::~string((string *)text);
          }
          lff_00 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar3 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          while (lff_00 != pcVar3) {
            local_1b8._M_dataplus._M_p._0_4_ = 0;
            cmMakefile::ExecuteCommand(mf,lff_00,(cmExecutionStatus *)text);
            if ((char)local_1b8._M_dataplus._M_p == '\x01') {
              local_1d8->ReturnInvoked = true;
              goto LAB_001bd2ae;
            }
            if (local_1b8._M_dataplus._M_p._1_1_ != '\0') goto LAB_001bd2ae;
            if (local_1b8._M_dataplus._M_p._2_1_ != '\0') break;
            bVar5 = cmSystemTools::GetFatalErrorOccured();
            lff_00 = lff_00 + 1;
            if (bVar5) goto LAB_001bd2ae;
          }
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::clear
                    ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)(local_200 + 8));
          cmMakefile::ExpandArguments
                    (mf,local_1d0,
                     (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      *)(local_200 + 8),(char *)0x0);
          bVar5 = cmConditionEvaluator::IsTrue
                            (&local_a0,
                             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              *)(local_200 + 8),(string *)local_198,&local_208);
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                               cmMakefile& mf,
                                               cmExecutionStatus& inStatus)
{
  // at end of for each execute recorded commands
  if (lff.Name.Lower == "while") {
    // record the number of while commands past this one
    this->Depth++;
  } else if (lff.Name.Lower == "endwhile") {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      MessageType messageType;

      cmListFileContext execContext = this->GetStartingContext();

      cmCommandContext commandContext;
      commandContext.Line = execContext.Line;
      commandContext.Name = execContext.Name;

      cmConditionEvaluator conditionEvaluator(mf, this->GetStartingContext(),
                                              mf.GetBacktrace(commandContext));

      bool isTrue =
        conditionEvaluator.IsTrue(expandedArguments, errorString, messageType);

      while (isTrue) {
        if (!errorString.empty()) {
          std::string err = "had incorrect arguments: ";
          for (cmListFileArgument const& arg : this->Args) {
            err += (arg.Delim ? "\"" : "");
            err += arg.Value;
            err += (arg.Delim ? "\"" : "");
            err += " ";
          }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == MessageType::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccured();
            return true;
          }
        }

        // Invoke all the functions that were collected in the block.
        for (cmListFileFunction const& fn : this->Functions) {
          cmExecutionStatus status;
          mf.ExecuteCommand(fn, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            return true;
          }
          if (status.GetBreakInvoked()) {
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(expandedArguments, errorString,
                                           messageType);
      }
      return true;
    }
    // decrement for each nested while that ends
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}